

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::HaveCxxStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  bool bVar1;
  char *test;
  char **ppcVar2;
  char *pcVar3;
  ostream *poVar4;
  char **ppcVar5;
  bool needCxx20;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  string local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"CMAKE_CXX_STANDARD_DEFAULT",(allocator<char> *)&local_208);
  test = GetDefinition(this,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (test == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    std::operator<<((ostream *)&e,
                    "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
                   );
    std::__cxx11::stringbuf::str();
    IssueMessage(this,INTERNAL_ERROR,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar1 = true;
  }
  else {
    cmStrCmp::cmStrCmp(&local_1c8,test);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (ppcVar2 == (char **)&cmMSVC60LinkLineComputer::vtable) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,
                               "The CMAKE_CXX_STANDARD_DEFAULT variable contains an invalid value: \""
                              );
      poVar4 = std::operator<<(poVar4,test);
      std::operator<<(poVar4,"\".");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,INTERNAL_ERROR,&local_208);
    }
    else {
      needCxx98 = false;
      needCxx11 = false;
      needCxx14 = false;
      needCxx17 = false;
      needCxx20 = false;
      CheckNeededCxxLanguage(this,feature,&needCxx98,&needCxx11,&needCxx14,&needCxx17,&needCxx20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CXX_STANDARD",(allocator<char> *)&local_208);
      pcVar3 = cmTarget::GetProperty(target,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (pcVar3 != (char *)0x0) {
        test = pcVar3;
      }
      cmStrCmp::cmStrCmp(&local_1e8,test);
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (ppcVar2 != (char **)&cmMSVC60LinkLineComputer::vtable) {
        if (needCxx20 == false) {
          if (needCxx17 == false) {
            if (needCxx14 == false) {
              if (needCxx11 == false) {
                ppcVar5 = (char **)0x0;
                if (needCxx98 != false) {
                  ppcVar5 = CXX_STANDARDS;
                }
              }
              else {
                ppcVar5 = CXX_STANDARDS + 1;
              }
            }
            else {
              ppcVar5 = CXX_STANDARDS + 2;
            }
          }
          else {
            ppcVar5 = CXX_STANDARDS + 3;
          }
        }
        else {
          ppcVar5 = CXX_STANDARDS + 4;
        }
        return ppcVar5 <= ppcVar2;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"The CXX_STANDARD property on target \"");
      poVar4 = std::operator<<(poVar4,(string *)&target->Name);
      poVar4 = std::operator<<(poVar4,"\" contained an invalid value: \"");
      poVar4 = std::operator<<(poVar4,test);
      std::operator<<(poVar4,"\".");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_208);
    }
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmMakefile::HaveCxxStandardAvailable(cmTarget const* target,
                                          const std::string& feature) const
{
  const char* defaultCxxStandard =
    this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
  if (!defaultCxxStandard) {
    std::ostringstream e;
    e << "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
         "not fully configured for this compiler.";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
  }
  if (std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(defaultCxxStandard)) == cm::cend(CXX_STANDARDS)) {
    std::ostringstream e;
    e << "The CMAKE_CXX_STANDARD_DEFAULT variable contains an "
         "invalid value: \""
      << defaultCxxStandard << "\".";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    return false;
  }

  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;
  bool needCxx20 = false;
  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17, needCxx20);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (!existingCxxStandard) {
    existingCxxStandard = defaultCxxStandard;
  }

  const char* const* existingCxxLevel =
    std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                 cmStrCmp(existingCxxStandard));
  if (existingCxxLevel == cm::cend(CXX_STANDARDS)) {
    std::ostringstream e;
    e << "The CXX_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }

  /* clang-format off */
  const char* const* needCxxLevel =
    needCxx20 ? &CXX_STANDARDS[4]
    : needCxx17 ? &CXX_STANDARDS[3]
    : needCxx14 ? &CXX_STANDARDS[2]
    : needCxx11 ? &CXX_STANDARDS[1]
    : needCxx98 ? &CXX_STANDARDS[0]
    : nullptr;
  /* clang-format on */

  return !needCxxLevel || needCxxLevel <= existingCxxLevel;
}